

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_decimal_fraction
          (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          string_type *result,error_code *ec)

{
  stream_source<unsigned_char> *this_00;
  pointer puVar1;
  uint8_t *puVar2;
  byte bVar3;
  ushort uVar4;
  uint64_t uVar5;
  uint64_t value;
  int64_t value_00;
  ssize_t sVar6;
  basic_bigint<std::allocator<unsigned_char>_> *n_00;
  cbor_errc cVar7;
  size_type length;
  _Alloc_hider buffer;
  uint8_t b;
  string_type str;
  bigint n;
  byte local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_bigint<std::allocator<unsigned_char>_> local_a8;
  basic_bigint<std::allocator<unsigned_char>_> local_80;
  basic_bigint<std::allocator<unsigned_char>_> local_58;
  
  uVar5 = get_uint64_value(this,ec);
  if (ec->_M_value != 0) {
    return;
  }
  if (uVar5 != 2) {
LAB_0027ae37:
    cVar7 = invalid_decimal_fraction;
LAB_0027ae3f:
    std::error_code::operator=(ec,cVar7);
    this->more_ = false;
    return;
  }
  this_00 = &this->source_;
  if ((this->source_).buffer_length_ == 0) {
    stream_source<unsigned_char>::fill_buffer(this_00);
  }
  if ((this->source_).buffer_length_ == 0) {
    uVar4 = 0x100;
  }
  else {
    uVar4 = (ushort)*(this->source_).buffer_data_;
  }
  if (0xff < uVar4) {
    cVar7 = unexpected_eof;
    goto LAB_0027ae3f;
  }
  bVar3 = (byte)uVar4 >> 5;
  if (bVar3 == 1) {
    uVar5 = get_int64_value(this,ec);
  }
  else {
    if (bVar3 != 0) goto LAB_0027ae37;
    uVar5 = get_uint64_value(this,ec);
  }
  if (ec->_M_value != 0) {
    return;
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  if ((this->source_).buffer_length_ == 0) {
    stream_source<unsigned_char>::fill_buffer(this_00);
  }
  uVar4 = 0x100;
  if ((this->source_).buffer_length_ != 0) {
    uVar4 = (ushort)*(this->source_).buffer_data_;
  }
  if (uVar4 < 0x100) {
    bVar3 = (byte)uVar4 >> 5;
    if (bVar3 == 6) {
      sVar6 = stream_source<unsigned_char>::read(this_00,(int)&local_c9,(void *)0x1,(ulong)uVar4);
      if (sVar6 == 0) {
LAB_0027af32:
        std::error_code::operator=(ec,unexpected_eof);
      }
      else {
        if ((this->source_).buffer_length_ == 0) {
          stream_source<unsigned_char>::fill_buffer(this_00);
        }
        uVar4 = 0x100;
        if ((this->source_).buffer_length_ != 0) {
          uVar4 = (ushort)*(this->source_).buffer_data_;
        }
        if (0xff < uVar4) goto LAB_0027af32;
        if ((uVar4 & 0xe0) != 0x40) goto LAB_0027b0f6;
        puVar1 = (this->bytes_buffer_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar1) {
          (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar1;
        }
        read_byte_string(this,&this->bytes_buffer_,ec);
        if (ec->_M_value == 0) {
          if ((local_c9 & 0x1f) == 3) {
            puVar2 = (this->bytes_buffer_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                      (&local_a8,1,puVar2,
                       (long)(this->bytes_buffer_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
            local_58.field_0._0_1_ = local_58.field_0._0_1_ & 0xfc | 2;
            local_58.field_0.common_stor_.length_ = 1;
            local_58.field_0.short_stor_.values_[0] = 1;
            local_58.field_0.short_stor_.values_[1] = 0;
            n_00 = basic_bigint<std::allocator<unsigned_char>_>::operator-=(&local_58,&local_a8);
            basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_80,n_00);
            basic_bigint<std::allocator<unsigned_char>_>::operator=(&local_a8,&local_80);
            if (((local_80.field_0._0_1_ & 1) != 0) &&
               ((pointer)local_80.field_0.short_stor_.values_[1] != (pointer)0x0)) {
              operator_delete(local_80.field_0.dynamic_stor_.data_,
                              local_80.field_0.short_stor_.values_[0] << 3);
            }
            if (((local_58.field_0._0_1_ & 1) != 0) &&
               ((pointer)local_58.field_0.short_stor_.values_[1] != (pointer)0x0)) {
              operator_delete(local_58.field_0.dynamic_stor_.data_,
                              local_58.field_0.short_stor_.values_[0] << 3);
            }
            basic_bigint<std::allocator<unsigned_char>>::
            write_string<char,std::char_traits<char>,std::allocator<char>>
                      ((basic_bigint<std::allocator<unsigned_char>> *)&local_a8,&local_c8);
          }
          else {
            if ((local_c9 & 0x1f) != 2) goto LAB_0027b0f6;
            puVar2 = (this->bytes_buffer_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                      (&local_a8,1,puVar2,
                       (long)(this->bytes_buffer_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
            basic_bigint<std::allocator<unsigned_char>>::
            write_string<char,std::char_traits<char>,std::allocator<char>>
                      ((basic_bigint<std::allocator<unsigned_char>> *)&local_a8,&local_c8);
          }
          if (((local_a8.field_0._0_1_ & 1) != 0) &&
             ((pointer)local_a8.field_0.short_stor_.values_[1] != (pointer)0x0)) {
            operator_delete(local_a8.field_0.dynamic_stor_.data_,
                            local_a8.field_0.short_stor_.values_[0] << 3);
          }
          goto LAB_0027b0f6;
        }
      }
      this->more_ = false;
      goto LAB_0027b12e;
    }
    if (bVar3 == 1) {
      value_00 = get_int64_value(this,ec);
      if (ec->_M_value != 0) goto LAB_0027b12e;
      detail::from_integer<long,std::__cxx11::string>(value_00,&local_c8);
LAB_0027b0f6:
      if ((uVar5 + 0x7fffffff >> 1 < 0x7fffffff && local_c8._M_string_length < 0x7fffffff) &&
         (local_c8._M_string_length != 0)) {
        length = local_c8._M_string_length;
        buffer._M_p = local_c8._M_dataplus._M_p;
        if (*local_c8._M_dataplus._M_p == '-') {
          std::__cxx11::string::push_back((char)result);
          buffer._M_p = local_c8._M_dataplus._M_p + 1;
          length = local_c8._M_string_length - 1;
        }
        detail::prettify_string<std::__cxx11::string>(buffer._M_p,length,(int)uVar5,-4,0x11,result);
        goto LAB_0027b12e;
      }
    }
    else if (bVar3 == 0) {
      value = get_uint64_value(this,ec);
      if (ec->_M_value != 0) goto LAB_0027b12e;
      detail::from_integer<unsigned_long,std::__cxx11::string>(value,&local_c8);
      goto LAB_0027b0f6;
    }
    cVar7 = invalid_decimal_fraction;
  }
  else {
    cVar7 = unexpected_eof;
  }
  std::error_code::operator=(ec,cVar7);
  this->more_ = false;
LAB_0027b12e:
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  read_decimal_fraction();
  return;
}

Assistant:

void read_decimal_fraction(string_type& result, std::error_code& ec)
    {
        std::size_t size = get_size(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (size != 2)
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        int64_t exponent = 0;
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                exponent = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                exponent = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_decimal_fraction;
                more_ = false;
                return;
            }
        }

        string_type str(alloc_);

        c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }

        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                jsoncons::detail::from_integer(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                jsoncons::detail::from_integer(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                uint8_t tag = get_additional_information_value(b);
                c = source_.peek();
                if (JSONCONS_UNLIKELY(c.eof))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                if (get_major_type(c.value) == jsoncons::cbor::detail::cbor_major_type::byte_string)
                {
                    bytes_buffer_.clear();
                    read_byte_string(bytes_buffer_, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    if (tag == 2)
                    {
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n.write_string(str);
                    }
                    else if (tag == 3)
                    {
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n = -1 - n;
                        n.write_string(str);
                    }
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_decimal_fraction;
                more_ = false;
                return;
            }
        }

        if (str.size() >= static_cast<std::size_t>((std::numeric_limits<int32_t>::max)()) || 
            exponent >= (std::numeric_limits<int32_t>::max)() || 
            exponent <= (std::numeric_limits<int32_t>::min)())
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }
        else if (str.size() > 0)
        {
            if (str[0] == '-')
            {
                result.push_back('-');
                jsoncons::detail::prettify_string(str.c_str()+1, str.size()-1, (int)exponent, -4, 17, result);
            }
            else
            {
                jsoncons::detail::prettify_string(str.c_str(), str.size(), (int)exponent, -4, 17, result);
            }
        }
        else
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }
    }